

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  long lVar1;
  size_t i;
  ulong uVar2;
  allocator local_29;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"[",&local_29);
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (ulong)(*(long *)(this + 8) - *(long *)this >> 2); uVar2 = uVar2 + 1) {
    Type::GetName((Type *)(*(long *)this + lVar1));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (uVar2 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    lVar1 = lVar1 + 4;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += types[i].GetName();
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}